

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O2

void Abc_SclTimeIncCheckLevel(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  uint uVar2;
  Abc_Obj_t *pObj;
  uint i;
  
  for (i = 0; (int)i < pNtk->vObjs->nSize; i = i + 1) {
    pObj = Abc_NtkObj(pNtk,i);
    if (pObj != (Abc_Obj_t *)0x0) {
      uVar1 = *(uint *)&pObj->field_0x14;
      uVar2 = Abc_ObjLevelNew(pObj);
      if (uVar1 >> 0xc != uVar2) {
        printf("Level of node %d is out of date!\n",(ulong)i);
      }
    }
  }
  return;
}

Assistant:

void Abc_SclTimeIncCheckLevel( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( (int)pObj->Level != Abc_ObjLevelNew(pObj) )
            printf( "Level of node %d is out of date!\n", i );
}